

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O0

InputParameter<3UL,_ruckig::StandardVector> * __thiscall
ruckig::InputParameter<3UL,_ruckig::StandardVector>::operator=
          (InputParameter<3UL,_ruckig::StandardVector> *this,
          InputParameter<3UL,_ruckig::StandardVector> *param_1)

{
  undefined7 uVar1;
  InputParameter<3UL,_ruckig::StandardVector> *param_1_local;
  InputParameter<3UL,_ruckig::StandardVector> *this_local;
  
  memcpy(this,param_1,0x130);
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::operator=
            (&this->intermediate_positions,&param_1->intermediate_positions);
  std::optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
  operator=(&this->per_section_max_velocity,&param_1->per_section_max_velocity);
  std::optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
  operator=(&this->per_section_max_acceleration,&param_1->per_section_max_acceleration);
  std::optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
  operator=(&this->per_section_max_jerk,&param_1->per_section_max_jerk);
  std::optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
  operator=(&this->per_section_min_velocity,&param_1->per_section_min_velocity);
  std::optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
  operator=(&this->per_section_min_acceleration,&param_1->per_section_min_acceleration);
  std::optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
  operator=(&this->per_section_max_position,&param_1->per_section_max_position);
  std::optional<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::
  operator=(&this->per_section_min_position,&param_1->per_section_min_position);
  memcpy(&this->max_position,&param_1->max_position,0x78);
  std::optional<std::vector<double,_std::allocator<double>_>_>::operator=
            (&this->per_section_minimum_duration,&param_1->per_section_minimum_duration);
  (this->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_payload =
       (param_1->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload
       .super__Optional_payload_base<double>._M_payload;
  uVar1 = *(undefined7 *)
           &(param_1->interrupt_calculation_duration).super__Optional_base<double,_true,_true>.
            _M_payload.super__Optional_payload_base<double>.field_0x9;
  (this->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_engaged =
       (param_1->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload
       .super__Optional_payload_base<double>._M_engaged;
  *(undefined7 *)
   &(this->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload.
    super__Optional_payload_base<double>.field_0x9 = uVar1;
  return this;
}

Assistant:

inline static double v_at_a_zero(double v0, double a0, double j) {
        return v0 + (a0 * a0) / (2 * j);
    }